

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QRectF>::begin(QList<QRectF> *this)

{
  QRectF *n;
  QArrayDataPointer<QRectF> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QRectF> *)0x9e63e9);
  QArrayDataPointer<QRectF>::operator->(in_RDI);
  n = QArrayDataPointer<QRectF>::begin((QArrayDataPointer<QRectF> *)0x9e63fa);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }